

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemKeyOwner(ImGuiKey key,ImGuiInputFlags flags)

{
  ImGuiID IVar1;
  uint in_ESI;
  ImGuiInputFlags in_EDI;
  ImGuiID unaff_retaddr;
  ImGuiID id;
  ImGuiContext *g;
  uint local_8;
  
  IVar1 = (GImGui->LastItemData).ID;
  if ((IVar1 != 0) && ((GImGui->HoveredId == IVar1 || (GImGui->ActiveId == IVar1)))) {
    local_8 = in_ESI;
    if ((in_ESI & 0x30) == 0) {
      local_8 = in_ESI | 0x30;
    }
    if (((GImGui->HoveredId == IVar1) && ((local_8 & 0x10) != 0)) ||
       ((GImGui->ActiveId == IVar1 && ((local_8 & 0x20) != 0)))) {
      SetKeyOwner(id,unaff_retaddr,in_EDI);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemKeyOwner(ImGuiKey key, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = g.LastItemData.ID;
    if (id == 0 || (g.HoveredId != id && g.ActiveId != id))
        return;
    if ((flags & ImGuiInputFlags_CondMask_) == 0)
        flags |= ImGuiInputFlags_CondDefault_;
    if ((g.HoveredId == id && (flags & ImGuiInputFlags_CondHovered)) || (g.ActiveId == id && (flags & ImGuiInputFlags_CondActive)))
    {
        IM_ASSERT((flags & ~ImGuiInputFlags_SupportedBySetItemKeyOwner) == 0); // Passing flags not supported by this function!
        SetKeyOwner(key, id, flags & ~ImGuiInputFlags_CondMask_);
    }
}